

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::setSimplexOptions(HEkk *this)

{
  HighsRandom *in_RDI;
  HighsUInt in_stack_ffffffffffffffec;
  
  *(undefined4 *)((long)&in_RDI[0x501].state + 4) = *(undefined4 *)(in_RDI[1].state + 0x170);
  *(undefined4 *)((long)&in_RDI[0x502].state + 4) = *(undefined4 *)(in_RDI[1].state + 0x238);
  in_RDI[0x503].state = *(uint64_t *)(in_RDI[1].state + 0x278);
  in_RDI[0x505].state = *(uint64_t *)(in_RDI[1].state + 0x280);
  in_RDI[0x506].state = *(uint64_t *)(in_RDI[1].state + 0x298);
  *(undefined4 *)&in_RDI[0x507].state = *(undefined4 *)(in_RDI[1].state + 0x17c);
  HighsRandom::initialise(in_RDI,in_stack_ffffffffffffffec);
  *(undefined1 *)((long)&in_RDI[0x519].state + 1) = 1;
  return;
}

Assistant:

void HEkk::setSimplexOptions() {
  // Copy values of HighsOptions for the simplex solver
  // Currently most of these options are straight copies, but they
  // will become valuable when "choose" becomes a HiGHS strategy value
  // that will need converting into a specific simplex strategy value.
  //
  // NB simplex_strategy is set by chooseSimplexStrategyThreads in each call
  //
  info_.dual_edge_weight_strategy = options_->simplex_dual_edge_weight_strategy;
  info_.price_strategy = options_->simplex_price_strategy;
  info_.dual_simplex_cost_perturbation_multiplier =
      options_->dual_simplex_cost_perturbation_multiplier;
  info_.primal_simplex_bound_perturbation_multiplier =
      options_->primal_simplex_bound_perturbation_multiplier;
  info_.factor_pivot_threshold = options_->factor_pivot_threshold;
  info_.update_limit = options_->simplex_update_limit;
  random_.initialise(options_->random_seed);

  // Set values of internal options
  info_.store_squared_primal_infeasibility = true;
}